

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_SimpleStringBuffer_resetWriteLimit_TestShell::createTest
          (TEST_SimpleStringBuffer_resetWriteLimit_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                                  ,0x263);
  this_00->_vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_0035c480;
  return this_00;
}

Assistant:

TEST(SimpleStringBuffer, resetWriteLimit)
{
    SimpleStringBuffer buffer;
    buffer.setWriteLimit(10);
    for (int i = 0; i < SimpleStringBuffer::SIMPLE_STRING_BUFFER_LEN ; i++)
        buffer.add("h");
    buffer.resetWriteLimit();
    buffer.add("%s", SimpleString("h", 10).asCharString());

    SimpleString str("h", 20);
    STRCMP_EQUAL(str.asCharString(), buffer.toString());
}